

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svm_helper.c
# Opt level: O2

void svm_load_seg_cache(CPUX86State *env,hwaddr addr,int seg_reg)

{
  uint uVar1;
  uint uVar2;
  SegmentCache sc1;
  SegmentCache local_30;
  
  svm_load_seg(env,addr,&local_30);
  env->segs[(uint)seg_reg].selector = local_30.selector;
  env->segs[(uint)seg_reg].base = local_30.base;
  env->segs[(uint)seg_reg].limit = local_30.limit;
  env->segs[(uint)seg_reg].flags = local_30.flags;
  if (seg_reg == 2) {
    env->hflags = env->hflags & 0xfffffffc | local_30.flags >> 0xd & 3;
    cpu_sync_bndcs_hflags_x86_64(env);
  }
  else if (seg_reg == 1) {
    uVar1 = env->hflags;
    if ((local_30.flags >> 0x15 & 1) == 0 || (uVar1 >> 0xe & 1) == 0) {
      uVar1 = uVar1 & 0xffff7fef | env->segs[1].flags >> 0x12 & 0x10;
    }
    else {
      uVar1 = uVar1 & 0xffff7f8f | 0x8030;
    }
    env->hflags = uVar1;
  }
  uVar1 = env->hflags;
  uVar2 = env->segs[2].flags >> 0x11 & 0x20;
  if (-1 < (short)uVar1) {
    if ((((env->cr[0] & 1) == 0) || ((uVar1 & 0x10) == 0)) || ((env->eflags & 0x20000) != 0)) {
      uVar2 = uVar2 | 0x40;
    }
    else {
      uVar2 = uVar2 | (uint)((env->segs[0].base != 0 || env->segs[3].base != 0) ||
                            env->segs[2].base != 0) << 6;
    }
  }
  env->hflags = uVar1 & 0xffffff9f | uVar2;
  return;
}

Assistant:

static inline void svm_load_seg_cache(CPUX86State *env, hwaddr addr,
                                      int seg_reg)
{
    SegmentCache sc1, *sc = &sc1;

    svm_load_seg(env, addr, sc);
    cpu_x86_load_seg_cache(env, seg_reg, sc->selector,
                           sc->base, sc->limit, sc->flags);
}